

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeAllocator::Deserialize
          (FixedSizeAllocator *this,MetadataManager *metadata_manager,BlockPointer *block_pointer)

{
  BlockManager *block_manager;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_00;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *segment_count;
  _Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false> this_01;
  mapped_type *pmVar1;
  __hashtable *__h;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var2;
  unsigned_long value;
  unsigned_long buffer_id;
  MetadataReader reader;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_e8;
  undefined8 uStack_e0;
  BlockPointer local_d8;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_c0;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_b8;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_b0;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_a8;
  MetadataReader local_a0;
  
  MetadataReader::MetadataReader(&local_a0,metadata_manager,*block_pointer);
  (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
  this->segment_size = (idx_t)local_e8;
  (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
  p_Var2 = local_e8;
  (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
  local_c0 = local_e8;
  this->total_segment_count = 0;
  if (p_Var2 != (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 *)0x0) {
    local_b8 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->buffers;
    do {
      (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
      local_a8 = local_e8;
      local_e8 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)0xffffffffffffffff;
      uStack_e0 = 0;
      (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,0x10);
      local_d8.block_id = (block_id_t)local_e8;
      local_d8.offset = (uint32_t)uStack_e0;
      local_d8.unused_padding = uStack_e0._4_4_;
      (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
      segment_count = local_e8;
      local_b0 = p_Var2;
      (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
      p_Var2 = local_e8;
      block_manager = this->block_manager;
      this_01._M_head_impl = (FixedSizeBuffer *)operator_new(0x80);
      FixedSizeBuffer::FixedSizeBuffer
                (this_01._M_head_impl,block_manager,(idx_t)segment_count,(idx_t)p_Var2,&local_d8);
      pmVar1 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_b8,(key_type *)&local_a8);
      this_00._M_head_impl =
           (pmVar1->
           super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
           .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl;
      (pmVar1->
      super_unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>)._M_t
      .super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
      .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl = this_01._M_head_impl;
      if (this_00._M_head_impl != (FixedSizeBuffer *)0x0) {
        FixedSizeBuffer::~FixedSizeBuffer(this_00._M_head_impl);
        operator_delete(this_00._M_head_impl);
      }
      this->total_segment_count = (idx_t)(segment_count + this->total_segment_count);
      p_Var2 = local_b0 + -1;
    } while (p_Var2 != (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)0x0);
  }
  if (local_c0 !=
      (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)0x0) {
    p_Var2 = local_c0;
    do {
      (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_e8,8);
      local_d8.block_id = (block_id_t)local_e8;
      local_e8 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->buffers_with_free_space;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->buffers_with_free_space,&local_d8,&local_e8);
      p_Var2 = p_Var2 + -1;
    } while (p_Var2 != (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)0x0);
  }
  MetadataReader::~MetadataReader(&local_a0);
  return;
}

Assistant:

void FixedSizeAllocator::Deserialize(MetadataManager &metadata_manager, const BlockPointer &block_pointer) {
	MetadataReader reader(metadata_manager, block_pointer);
	segment_size = reader.Read<idx_t>();
	auto buffer_count = reader.Read<idx_t>();
	auto buffers_with_free_space_count = reader.Read<idx_t>();

	total_segment_count = 0;

	for (idx_t i = 0; i < buffer_count; i++) {
		auto buffer_id = reader.Read<idx_t>();
		auto buffer_block_pointer = reader.Read<BlockPointer>();
		auto segment_count = reader.Read<idx_t>();
		auto allocation_size = reader.Read<idx_t>();
		buffers[buffer_id] =
		    make_uniq<FixedSizeBuffer>(block_manager, segment_count, allocation_size, buffer_block_pointer);
		total_segment_count += segment_count;
	}
	for (idx_t i = 0; i < buffers_with_free_space_count; i++) {
		buffers_with_free_space.insert(reader.Read<idx_t>());
	}
}